

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffs.c
# Opt level: O2

FFSEncodeVector copy_vector_to_FFSBuffer(FFSBuffer buf,FFSEncodeVector vec)

{
  size_t sVar1;
  ssize_t sVar2;
  FFSEncodeVector pFVar3;
  ulong uVar4;
  size_t sVar5;
  
  pFVar3 = (FFSEncodeVector)buf->tmp_buffer;
  if ((vec < pFVar3) || ((FFSEncodeVector)((long)&pFVar3->iov_base + buf->tmp_buffer_size) <= vec))
  {
    sVar1 = 0;
    do {
      sVar5 = sVar1;
      sVar1 = sVar5 + 0x10;
    } while (*(long *)((long)&vec->iov_base + sVar5) != 0);
    sVar2 = add_to_tmp_buffer(buf,sVar5 + 0x20);
    uVar4 = sVar2 + 0xfU & 0xfffffffffffffff0;
    memcpy((void *)((long)buf->tmp_buffer + uVar4),vec,sVar5 + 0x10);
    pFVar3 = (FFSEncodeVector)buf->tmp_buffer;
  }
  else {
    uVar4 = (long)vec - (long)pFVar3;
  }
  return (FFSEncodeVector)((long)&pFVar3->iov_base + uVar4);
}

Assistant:

extern FFSEncodeVector
copy_vector_to_FFSBuffer(FFSBuffer buf, FFSEncodeVector vec)
{
    ssize_t vec_offset = (char *) vec - (char *)buf->tmp_buffer;

    if (((char*)vec < (char*)buf->tmp_buffer)
        || ((char*)vec >= (char*)buf->tmp_buffer + buf->tmp_buffer_size)) {
        size_t i, remainder;
        for (i = 0; vec[i].iov_base; ++i);
        vec_offset = add_to_tmp_buffer(buf, (i + 2) * sizeof(*vec));
	remainder = vec_offset % sizeof(*vec);
	if (remainder != 0) {
	    vec_offset += sizeof(*vec) - remainder;
	}
        memcpy((char *) buf->tmp_buffer + vec_offset, vec, (i + 1) * sizeof(*vec));
    }

    return (FFSEncodeVector) ((char *) buf->tmp_buffer + vec_offset);
}